

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.cxx
# Opt level: O3

void __thiscall cmCTestUploadCommand::CheckArguments(cmCTestUploadCommand *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  long lVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  long lVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  
  _Var5._M_current =
       (this->Files).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->Files).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pbVar1 - (long)_Var5._M_current;
  if (0 < lVar4 >> 7) {
    lVar3 = (lVar4 >> 7) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)this,_Var5);
      __first._M_current = _Var5._M_current;
      if (bVar2) goto LAB_001e29dc;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)this,
                         _Var5._M_current + 1);
      __first._M_current = _Var5._M_current + 1;
      if (bVar2) goto LAB_001e29dc;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)this,
                         _Var5._M_current + 2);
      __first._M_current = _Var5._M_current + 2;
      if (bVar2) goto LAB_001e29dc;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)this,
                         _Var5._M_current + 3);
      __first._M_current = _Var5._M_current + 3;
      if (bVar2) goto LAB_001e29dc;
      _Var5._M_current = _Var5._M_current + 4;
      lVar3 = lVar3 + -1;
      lVar4 = lVar4 + -0x80;
    } while (1 < lVar3);
  }
  lVar4 = lVar4 >> 5;
  if (lVar4 == 1) {
LAB_001e29c8:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                      ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)this,_Var5);
    __first._M_current = _Var5._M_current;
    if (!bVar2) {
      __first._M_current = pbVar1;
    }
  }
  else if (lVar4 == 2) {
LAB_001e29af:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                      ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)this,_Var5);
    __first._M_current = _Var5._M_current;
    if (!bVar2) {
      _Var5._M_current = _Var5._M_current + 1;
      goto LAB_001e29c8;
    }
  }
  else {
    __first._M_current = pbVar1;
    if (lVar4 != 3) goto LAB_001e2a21;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                      ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)this,_Var5);
    __first._M_current = _Var5._M_current;
    if (!bVar2) {
      _Var5._M_current = _Var5._M_current + 1;
      goto LAB_001e29af;
    }
  }
LAB_001e29dc:
  _Var5._M_current = __first._M_current + 1;
  if (_Var5._M_current != pbVar1 && __first._M_current != pbVar1) {
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<cmCTestUploadCommand::CheckArguments()::$_0>::operator()
                        ((_Iter_pred<cmCTestUploadCommand::CheckArguments()::__0> *)this,_Var5);
      if (!bVar2) {
        std::__cxx11::string::operator=((string *)__first._M_current,(string *)_Var5._M_current);
        __first._M_current = __first._M_current + 1;
      }
      _Var5._M_current = _Var5._M_current + 1;
    } while (_Var5._M_current != pbVar1);
  }
LAB_001e2a21:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&(this->Files).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ,(iterator)__first._M_current,
             (this->Files).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void cmCTestUploadCommand::CheckArguments()
{
  cm::erase_if(this->Files, [this](std::string const& arg) -> bool {
    if (!cmSystemTools::FileExists(arg)) {
      std::ostringstream e;
      e << "File \"" << arg << "\" does not exist. Cannot submit "
        << "a non-existent file.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return true;
    }
    return false;
  });
}